

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ghc::options::lines(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *__return_storage_ptr__,string *text,int width)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  reference pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  char *local_a8;
  char *local_a0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  const_iterator wordStart;
  string word;
  int local_60;
  int local_5c;
  int wordLength;
  int lineLength;
  string line;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  const_iterator end;
  const_iterator iter;
  int width_local;
  string *text_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines;
  
  end._M_current = (char *)std::__cxx11::string::begin();
  local_30._M_current = (char *)std::__cxx11::string::end();
  line.field_2._M_local_buf[0xf] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&wordLength);
  local_5c = 0;
  local_60 = 0;
  std::__cxx11::string::reserve((ulong)&wordLength);
  while (bVar1 = __gnu_cxx::operator!=(&end,&local_30), bVar1) {
    std::__cxx11::string::string((string *)&wordStart);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&end,&local_30);
      bVar1 = false;
      if (bVar2) {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&end);
        iVar3 = isspace((int)*pcVar4);
        bVar1 = false;
        if (iVar3 != 0) {
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&end);
          bVar1 = *pcVar4 != '\n';
        }
      }
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&end);
    }
    local_98._M_current = end._M_current;
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&end,&local_30);
      bVar1 = false;
      if (bVar2) {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&end);
        iVar3 = isspace((int)*pcVar4);
        bVar1 = iVar3 == 0;
      }
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&end);
      local_60 = local_60 + 1;
    }
    if (local_60 != 0) {
      local_a0 = local_98._M_current;
      local_a8 = end._M_current;
      std::__cxx11::string::
      assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)&wordStart,local_98,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )end._M_current);
      if (local_5c + local_60 + 1 < width) {
        std::operator+(&local_c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &wordStart,anon_var_dwarf_5f618 + 0x3fe5);
        std::__cxx11::string::operator+=((string *)&wordLength,(string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        local_5c = local_60 + 1 + local_5c;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&wordLength);
        std::operator+(&local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &wordStart,anon_var_dwarf_5f618 + 0x3fe5);
        std::__cxx11::string::operator=((string *)&wordLength,(string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        local_5c = local_60 + 1;
      }
      local_60 = 0;
    }
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&end);
    if (*pcVar4 == '\n') {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&wordLength);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&end);
      std::__cxx11::string::clear();
      local_5c = 0;
    }
    std::__cxx11::string::~string((string *)&wordStart);
  }
  if (local_5c != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&wordLength);
  }
  line.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)&wordLength);
  if ((line.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::string> lines(const std::string& text, int width)
    {
        std::string::const_iterator iter = text.begin();
        std::string::const_iterator end = text.end();
        std::vector<std::string> lines;
        std::string line;
        int lineLength = 0, wordLength = 0;
        line.reserve(width);
        while(iter != end) {
            std::string word;
            while(iter != end && std::isspace(*iter) && *iter != '\n') {
                ++iter;
            }
            auto wordStart = iter;
            while(iter != end && !std::isspace(*iter)) {
                ++iter;
                ++wordLength;
            }
            if(wordLength) {
                word.assign(wordStart, iter);
                if(lineLength + wordLength + 1 < width) {
                    line += word + " ";
                    lineLength += wordLength + 1;
                }
                else {
                    lines.push_back(line);
                    line = word + " ";
                    lineLength = wordLength + 1;
                }
                wordLength = 0;
            }
            if(*iter == '\n') {
                lines.push_back(line);
                ++iter;
                line.clear();
                lineLength = 0;
            }
        }
        if(lineLength) {
            lines.push_back(line);
        }
        return lines;
    }